

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O0

ssize_t __thiscall
Fl_Preferences::RootNode::read(RootNode *this,int __fd,void *__buf,size_t __nbytes)

{
  FILE *__stream;
  char *pcVar1;
  size_t sVar2;
  size_t end_2;
  size_t end_1;
  size_t end;
  Node *nd;
  FILE *f;
  char buf [1024];
  RootNode *this_local;
  
  if (this->filename_ == (char *)0x0) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    buf._1016_8_ = this;
    __stream = (FILE *)fl_fopen(this->filename_,"rb");
    if (__stream == (FILE *)0x0) {
      this_local._4_4_ = 0xffffffff;
    }
    else {
      fgets((char *)&f,0x400,__stream);
      fgets((char *)&f,0x400,__stream);
      fgets((char *)&f,0x400,__stream);
      end = (size_t)this->prefs_->node;
      while (pcVar1 = fgets((char *)&f,0x400,__stream), pcVar1 != (char *)0x0) {
        if ((char)f == '[') {
          sVar2 = strcspn((char *)((long)&f + 1),"]\n\r");
          buf[sVar2 - 7] = '\0';
          end = (size_t)Node::find(this->prefs_->node,(char *)((long)&f + 1));
        }
        else if ((char)f == '+') {
          sVar2 = strcspn((char *)((long)&f + 1),"\n\r");
          if (sVar2 != 0) {
            buf[sVar2 - 7] = '\0';
            Node::add((Node *)end,(char *)((long)&f + 1));
          }
        }
        else {
          sVar2 = strcspn((char *)&f,"\n\r");
          if (sVar2 != 0) {
            buf[sVar2 - 8] = '\0';
            Node::set((Node *)end,(char *)&f);
          }
        }
      }
      fclose(__stream);
      this_local._4_4_ = 0;
    }
  }
  return (ulong)this_local._4_4_;
}

Assistant:

int Fl_Preferences::RootNode::read() {
  if (!filename_)   // RUNTIME preferences
    return -1; 
  char buf[1024];
  FILE *f = fl_fopen( filename_, "rb" );
  if ( !f )
    return -1; 
  if (fgets( buf, 1024, f )==0) { /* ignore */ }
  if (fgets( buf, 1024, f )==0) { /* ignore */ }
  if (fgets( buf, 1024, f )==0) { /* ignore */ }
  Node *nd = prefs_->node;
  for (;;) {
    if ( !fgets( buf, 1024, f ) ) break;	// EOF or Error
    if ( buf[0]=='[' ) {			// read a new group
      size_t end = strcspn( buf+1, "]\n\r" );
      buf[ end+1 ] = 0;
      nd = prefs_->node->find( buf+1 );
    } else if ( buf[0]=='+' ) {			// value of previous name/value pair spans multiple lines
      size_t end = strcspn( buf+1, "\n\r" );
      if ( end != 0 ) {				// if entry is not empty
	buf[ end+1 ] = 0;
	nd->add( buf+1 );
      }
    } else {					 // read a name/value pair
      size_t end = strcspn( buf, "\n\r" );
      if ( end != 0 ) {				// if entry is not empty
	buf[ end ] = 0;
	nd->set( buf );
      }
    }
  }
  fclose( f );
  return 0;
}